

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlHandle __thiscall despot::util::tinyxml::TiXmlHandle::FirstChild(TiXmlHandle *this,char *value)

{
  TiXmlNode *_node;
  char *in_RDX;
  TiXmlNode *child;
  char *value_local;
  TiXmlHandle *this_local;
  
  if ((*(long *)value == 0) ||
     (_node = TiXmlNode::FirstChild(*(TiXmlNode **)value,in_RDX), _node == (TiXmlNode *)0x0)) {
    TiXmlHandle(this,(TiXmlNode *)0x0);
  }
  else {
    TiXmlHandle(this,_node);
  }
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::FirstChild(const char * value) const {
	if (node) {
		TiXmlNode* child = node->FirstChild(value);
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}